

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jh_list.h
# Opt level: O2

iterator __thiscall JetHead::list<Timer::TimerNode>::iterator::erase(iterator *this)

{
  Node *pNVar1;
  Node *pNVar2;
  undefined8 *in_RSI;
  Node *this_00;
  
  this_00 = (Node *)*in_RSI;
  if (this_00 == (Node *)0x0) {
    this_00 = (Node *)0x0;
  }
  else {
    pNVar1 = this_00->next;
    if ((pNVar1 != (Node *)0x0) && (pNVar2 = this_00->prev, pNVar2 != (Node *)0x0)) {
      pNVar2->next = pNVar1;
      pNVar1->prev = pNVar2;
      SmartPtr<Event>::~SmartPtr((SmartPtr<Event> *)this_00);
      operator_delete(this_00,0x38);
      *in_RSI = 0;
      this_00 = pNVar1;
    }
  }
  this->mNode = this_00;
  return (iterator)(Node *)this;
}

Assistant:

iterator erase()
			{
				// Don't segfault, and don't delete head or tail
				// placeholder nodes 
				if (mNode == NULL or 
					mNode->next == NULL or 
					mNode->prev == NULL) 
				{
					return *this;
				}

				Node* prev = mNode->prev;
				Node* next = mNode->next;

				prev->next = next;
				next->prev = prev;

				delete mNode;
				mNode = NULL;

				iterator ret;
				ret.mNode = next;
				return ret;
			}